

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O0

void __thiscall cppcms::archive::archive(archive *this,archive *other)

{
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)(in_RSI + 0x20);
  *(undefined4 *)(in_RDI + 0x28) = *(undefined4 *)(in_RSI + 0x28);
  booster::copy_ptr<cppcms::archive::_data>::copy_ptr
            ((copy_ptr<cppcms::archive::_data> *)(in_RDI + 0x30));
  return;
}

Assistant:

archive::archive(archive const &other) :
	buffer_(other.buffer_),
	ptr_(other.ptr_),
	mode_(other.mode_)
{
}